

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake.c
# Opt level: O0

size_t bakeBPACE_deep(size_t n,size_t f_deep,size_t ec_d,size_t ec_deep)

{
  size_t sVar1;
  size_t ec_d_00;
  size_t ec_deep_00;
  size_t ec_d_01;
  size_t sVar2;
  size_t sVar3;
  size_t in_RCX;
  size_t in_RDX;
  size_t in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  
  sVar1 = bakeBPACEStart_deep(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                              in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  ec_d_00 = bakeBPACEStep2_deep(in_stack_ffffffffffffffc0,sVar1,in_stack_ffffffffffffffb0,
                                in_stack_ffffffffffffffa8);
  ec_deep_00 = bakeBPACEStep3_deep(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,ec_d_00,sVar1
                                  );
  ec_d_01 = bakeBPACEStep4_deep(unaff_retaddr,in_RDI,in_RSI,in_RDX);
  sVar2 = bakeBPACEStep5_deep(in_RCX,in_stack_ffffffffffffffd8,ec_d_01,ec_deep_00);
  sVar3 = bakeBPACEStep6_deep(ec_d_00,sVar1,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  sVar1 = utilMax(6,sVar1,ec_d_00,ec_deep_00,ec_d_01,sVar2,sVar3);
  return sVar1;
}

Assistant:

static size_t bakeBPACE_deep(size_t n, size_t f_deep, size_t ec_d,
	size_t ec_deep)
{
	return utilMax(6,
		bakeBPACEStart_deep(n, f_deep, ec_d, ec_deep),
		bakeBPACEStep2_deep(n, f_deep, ec_d, ec_deep),
		bakeBPACEStep3_deep(n, f_deep, ec_d, ec_deep),
		bakeBPACEStep4_deep(n, f_deep, ec_d, ec_deep),
		bakeBPACEStep5_deep(n, f_deep, ec_d, ec_deep),
		bakeBPACEStep6_deep(n, f_deep, ec_d, ec_deep));
}